

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall
cmake::AppendExtraGeneratorsDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  pointer pcVar1;
  cmExternalMakefileProjectGeneratorFactory *this_00;
  pointer pbVar2;
  pointer pbVar3;
  cmDocumentationEntry e;
  string doc;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generators;
  undefined1 local_108 [32];
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  char local_c8;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *local_c0;
  string local_b8;
  pointer local_98;
  pointer local_90;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_90 = (this->ExtraGenerators).
             super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_98 = (this->ExtraGenerators).
             super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_90 != local_98) {
    pcVar1 = local_108 + 0x10;
    local_c0 = v;
    do {
      this_00 = *local_90;
      cmExternalMakefileProjectGeneratorFactory::GetDocumentation_abi_cxx11_(&local_b8,this_00);
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_88,this_00);
      pbVar3 = (this_00->Aliases).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar2 = (this_00->Aliases).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar3; pbVar2 = pbVar2 + 1
          ) {
        local_108._8_8_ = 0;
        local_108[0x10] = '\0';
        local_e8._M_p = (pointer)&local_d8;
        local_e0 = 0;
        local_d8._M_local_buf[0] = '\0';
        local_c8 = ' ';
        local_108._0_8_ = pcVar1;
        std::__cxx11::string::_M_assign((string *)local_108);
        std::__cxx11::string::_M_assign((string *)&local_e8);
        std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
        emplace_back<cmDocumentationEntry>(local_c0,(cmDocumentationEntry *)local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_p != &local_d8) {
          operator_delete(local_e8._M_p,
                          CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) +
                          1);
        }
        if ((pointer)local_108._0_8_ != pcVar1) {
          operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
        }
      }
      cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
                (&local_68,this_00);
      pbVar2 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar3 = local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar2; pbVar3 = pbVar3 + 1
          ) {
        local_108._8_8_ = 0;
        local_108[0x10] = '\0';
        local_e8._M_p = (pointer)&local_d8;
        local_e0 = 0;
        local_d8._M_local_buf[0] = '\0';
        local_c8 = ' ';
        local_108._0_8_ = pcVar1;
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&local_50,pbVar3,&local_88);
        std::__cxx11::string::operator=((string *)local_108,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)&local_e8);
        std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
        emplace_back<cmDocumentationEntry>(local_c0,(cmDocumentationEntry *)local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_p != &local_d8) {
          operator_delete(local_e8._M_p,
                          CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) +
                          1);
        }
        if ((pointer)local_108._0_8_ != pcVar1) {
          operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_90 = local_90 + 1;
    } while (local_90 != local_98);
  }
  return;
}

Assistant:

void cmake::AppendExtraGeneratorsDocumentation(
  std::vector<cmDocumentationEntry>& v)
{
  for (cmExternalMakefileProjectGeneratorFactory* eg : this->ExtraGenerators) {
    const std::string doc = eg->GetDocumentation();
    const std::string name = eg->GetName();

    // Aliases:
    for (std::string const& a : eg->Aliases) {
      cmDocumentationEntry e;
      e.Name = a;
      e.Brief = doc;
      v.push_back(std::move(e));
    }

    // Full names:
    const std::vector<std::string> generators =
      eg->GetSupportedGlobalGenerators();
    for (std::string const& g : generators) {
      cmDocumentationEntry e;
      e.Name =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(g, name);
      e.Brief = doc;
      v.push_back(std::move(e));
    }
  }
}